

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::Population(Population *this,World *w,size_t creatno,size_t els)

{
  Creature *this_00;
  type this_01;
  double local_58 [3];
  undefined1 local_40 [8];
  shared_ptr<Creature> nc;
  size_t i;
  size_t els_local;
  size_t creatno_local;
  World *w_local;
  Population *this_local;
  
  this->_vptr_Population = (_func_int **)&PTR__Population_00147578;
  this->ELITE_SIZE = els;
  this->world = w;
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::vector
            (&this->creats);
  std::vector<double,_std::allocator<double>_>::vector(&this->fitdict);
  for (nc.pn.pi_ = (sp_counted_base *)0x0; nc.pn.pi_ < creatno;
      nc.pn.pi_ = (sp_counted_base *)((long)&(nc.pn.pi_)->_vptr_sp_counted_base + 1)) {
    this_00 = (Creature *)operator_new(0x50);
    Creature::Creature(this_00,this,1);
    boost::shared_ptr<Creature>::shared_ptr<Creature>((shared_ptr<Creature> *)local_40,this_00);
    std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
    push_back(&this->creats,(value_type *)local_40);
    this_01 = boost::shared_ptr<Creature>::operator->((shared_ptr<Creature> *)local_40);
    local_58[0] = Creature::get_fitness(this_01);
    std::vector<double,_std::allocator<double>_>::push_back(&this->fitdict,local_58);
    boost::shared_ptr<Creature>::~shared_ptr((shared_ptr<Creature> *)local_40);
  }
  return;
}

Assistant:

Population::Population( World * w, size_t creatno, size_t els ) :
	ELITE_SIZE(els), world(w)
{
	for(size_t i = 0; i < creatno; ++i)
	{
		boost::shared_ptr<Creature> nc(new Creature(this));
		creats.push_back(nc);
		fitdict.push_back(nc->get_fitness());

	}
}